

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::val::ValidationState_t::GetComponentType(ValidationState_t *this,uint32_t id)

{
  Op OVar1;
  uint32_t uVar2;
  Instruction *this_00;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x361,
                  "uint32_t spvtools::val::ValidationState_t::GetComponentType(uint32_t) const");
  }
  OVar1 = Instruction::opcode(this_00);
  this_local._4_4_ = id;
  if (2 < OVar1 - OpTypeBool) {
    if (OVar1 == OpTypeVector) {
      this_local._4_4_ = Instruction::word(this_00,2);
    }
    else if (OVar1 == OpTypeMatrix) {
      uVar2 = Instruction::word(this_00,2);
      this_local._4_4_ = GetComponentType(this,uVar2);
    }
    else if (OVar1 == OpTypeArray) {
      this_local._4_4_ = Instruction::word(this_00,2);
    }
    else if ((OVar1 == OpTypeCooperativeMatrixKHR) || (OVar1 == OpTypeCooperativeMatrixNV)) {
      this_local._4_4_ = Instruction::word(this_00,2);
    }
    else {
      uVar2 = Instruction::type_id(this_00);
      if (uVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x37c,
                      "uint32_t spvtools::val::ValidationState_t::GetComponentType(uint32_t) const")
        ;
      }
      uVar2 = Instruction::type_id(this_00);
      this_local._4_4_ = GetComponentType(this,uVar2);
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ValidationState_t::GetComponentType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  switch (inst->opcode()) {
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeBool:
      return id;

    case spv::Op::OpTypeArray:
      return inst->word(2);

    case spv::Op::OpTypeVector:
      return inst->word(2);

    case spv::Op::OpTypeMatrix:
      return GetComponentType(inst->word(2));

    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return inst->word(2);

    default:
      break;
  }

  if (inst->type_id()) return GetComponentType(inst->type_id());

  assert(0);
  return 0;
}